

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O0

void __thiscall xLearn::Checker::check_conflict_train(Checker *this,HyperParam *hyper_param)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  long in_RSI;
  string *in_stack_fffffffffffffe20;
  string *out;
  string local_190 [32];
  string local_170 [32];
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [8];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  if (((*(byte *)(in_RSI + 0x1ec) & 1) == 0) && ((*(byte *)(in_RSI + 0x1ee) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,
               "Transform DMatrix not from file doesn\'t support cross-validation. xLearn has already disable the -cv option."
               ,&local_31);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    *(undefined1 *)(local_10 + 0x1ee) = 0;
  }
  if (((*(byte *)(local_10 + 1) & 1) != 0) && ((*(byte *)(local_10 + 0x1ee) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,
               "On-disk training doesn\'t support cross-validation. xLearn has already disable the -cv option."
               ,&local_69);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    *(undefined1 *)(local_10 + 0x1ee) = 0;
  }
  if (((*(byte *)(local_10 + 0x1ee) & 1) != 0) && ((*(byte *)(local_10 + 500) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "Cross-validation doesn\'t support early-stopping. xLearn has already close early-stopping."
               ,&local_91);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    *(undefined1 *)(local_10 + 500) = 0;
  }
  if (((*(byte *)(local_10 + 0x1ee) & 1) != 0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    uVar3 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_
              ((char *)local_b8,
               "The --cv (cross-validation) has been set, and xLearn will ignore the validation file: %s"
               ,uVar3);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::clear();
  }
  if (((*(byte *)(local_10 + 0x1ee) & 1) != 0) && ((*(byte *)(local_10 + 2) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d8,
               "The --cv (cross-validation) has been set, and xLearn will ignore the --quiet option."
               ,&local_d9);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    *(undefined1 *)(local_10 + 2) = 0;
  }
  if (((*(byte *)(local_10 + 0x1ee) & 1) != 0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,
               "The --cv (cross-validation) has been set, and xLearn will not dump model checkpoint to disk."
               ,&local_101);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::clear();
  }
  uVar2 = std::__cxx11::string::empty();
  if ((((uVar2 & 1) != 0) && (*(long *)(local_10 + 0x138) == 0)) &&
     ((*(byte *)(local_10 + 500) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,
               "Validation file(dataset) not found, xLearn has already disable early-stopping.",
               &local_129);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    *(undefined1 *)(local_10 + 500) = 0;
  }
  iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48));
  if (((iVar1 != 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) &&
     ((*(long *)(local_10 + 0x138) == 0 && ((*(byte *)(local_10 + 0x1ee) & 1) == 0)))) {
    uVar3 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_
              ((char *)local_150,
               "Validation file not found, xLearn has already disable (-x %s) option.",uVar3);
    Color::print_warning(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::operator=((string *)(local_10 + 0x48),"none");
  }
  iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x28));
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48));
    if ((((iVar1 == 0) ||
         (iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48)), iVar1 == 0)) ||
        (iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48)), iVar1 == 0)) ||
       (iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48)), iVar1 == 0)) {
      uVar3 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_
                ((char *)local_170,
                 "The -x: %s metric can only be used in classification tasks. xLearn will ignore this option."
                 ,uVar3);
      Color::print_warning(in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::operator=((string *)(local_10 + 0x48),"none");
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x28));
    if ((iVar1 == 0) &&
       (((iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48)), iVar1 == 0 ||
         (iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48)), iVar1 == 0)) ||
        ((iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48)), iVar1 == 0 ||
         (iVar1 = std::__cxx11::string::compare((char *)(local_10 + 0x48)), iVar1 == 0)))))) {
      uVar3 = std::__cxx11::string::c_str();
      out = local_190;
      StringPrintf_abi_cxx11_
                ((char *)out,
                 "The -x: %s metric can only be used in regression tasks. xLearn will ignore this option."
                 ,uVar3);
      Color::print_warning(out);
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::operator=((string *)(local_10 + 0x48),"none");
    }
  }
  return;
}

Assistant:

void Checker::check_conflict_train(HyperParam& hyper_param) {
  if (!hyper_param.from_file && hyper_param.cross_validation) {
    Color::print_warning("Transform DMatrix not from file doesn't support cross-validation. "
                         "xLearn has already disable the -cv option.");
    hyper_param.cross_validation = false;
  }
  if (hyper_param.on_disk && hyper_param.cross_validation) {
    Color::print_warning("On-disk training doesn't support cross-validation. "
                         "xLearn has already disable the -cv option.");
    hyper_param.cross_validation = false;
  }
  if (hyper_param.cross_validation && hyper_param.early_stop) {
    Color::print_warning("Cross-validation doesn't support early-stopping. "
                         "xLearn has already close early-stopping.");
    hyper_param.early_stop = false;
  }
  if (hyper_param.cross_validation && !hyper_param.test_set_file.empty()) {
    Color::print_warning(
      StringPrintf("The --cv (cross-validation) has been set, and "
                   "xLearn will ignore the validation file: %s",
                   hyper_param.test_set_file.c_str())
    );
    hyper_param.validate_set_file.clear();
  }
  if (hyper_param.cross_validation && hyper_param.quiet) {
    Color::print_warning("The --cv (cross-validation) has been set, and "
                         "xLearn will ignore the --quiet option.");
    hyper_param.quiet = false;
  }
  if (hyper_param.cross_validation && !hyper_param.model_file.empty()) {
    Color::print_warning("The --cv (cross-validation) has been set, and "
                         "xLearn will not dump model checkpoint to disk.");
    hyper_param.model_file.clear();
  }
  if ((hyper_param.validate_set_file.empty() && hyper_param.valid_dataset == nullptr) 
      && hyper_param.early_stop) {
    Color::print_warning("Validation file(dataset) not found, xLearn has already "
                         "disable early-stopping.");
    hyper_param.early_stop = false;
  }
  if (hyper_param.metric.compare("none") != 0 &&
      hyper_param.validate_set_file.empty() && 
      hyper_param.valid_dataset == nullptr &&
      !hyper_param.cross_validation) {
    Color::print_warning(
      StringPrintf("Validation file not found, xLearn has already "
                   "disable (-x %s) option.", 
                   hyper_param.metric.c_str())
    );
    hyper_param.metric = "none";
  }
  if (hyper_param.loss_func.compare("squared") == 0) {
    if (hyper_param.metric.compare("acc") == 0 ||
        hyper_param.metric.compare("prec") == 0 ||
        hyper_param.metric.compare("recall") == 0 ||
        hyper_param.metric.compare("f1") == 0) {
      Color::print_warning(
        StringPrintf("The -x: %s metric can only be used "
                     "in classification tasks. xLearn will "
                     "ignore this option.",
                     hyper_param.metric.c_str())
      );
      hyper_param.metric = "none";
    }
  } else if (hyper_param.loss_func.compare("cross-entropy") == 0) {
    if (hyper_param.metric.compare("mae") == 0 ||
        hyper_param.metric.compare("mape") == 0 ||
        hyper_param.metric.compare("rmsd") == 0 ||
        hyper_param.metric.compare("rmse") == 0) {
      Color::print_warning(
        StringPrintf("The -x: %s metric can only be used "
                     "in regression tasks. xLearn will ignore "
                     "this option.",
                     hyper_param.metric.c_str())
      );
      hyper_param.metric = "none";
    }
  }
}